

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Assign<duckdb::hugeint_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::string_t>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::string_t> *state,hugeint_t *x,string_t *y,
               bool x_null)

{
  int64_t iVar1;
  undefined7 in_register_00000009;
  string_t new_value;
  
  new_value.value._9_7_ = in_register_00000009;
  new_value.value.inlined.inlined[4] = x_null;
  iVar1 = x->upper;
  (state->arg).lower = x->lower;
  (state->arg).upper = iVar1;
  new_value.value._0_8_ = (y->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,*(string_t **)&y->value,new_value);
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}